

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O2

void xmlSAX2AttributeInternal(void *ctx,xmlChar *fullname,xmlChar *value,xmlChar *prefix)

{
  long lVar1;
  code *pcVar2;
  int iVar3;
  uint uVar4;
  xmlChar *pxVar5;
  xmlURIPtr pxVar6;
  xmlURIPtr pxVar7;
  xmlURIPtr pxVar8;
  xmlNsPtr pxVar9;
  _xmlNode *attr;
  xmlNodePtr pxVar10;
  _xmlNode *p_Var11;
  _xmlNode *p_Var12;
  xmlChar *pxVar13;
  xmlDocPtr pxVar14;
  long *plVar15;
  xmlChar *ns;
  xmlURIPtr local_38;
  
  if (*(int *)((long)ctx + 0x34) == 0) {
    pxVar5 = xmlSplitQName((xmlParserCtxtPtr)ctx,fullname,&ns);
    if (pxVar5 != (xmlChar *)0x0) {
      if (*pxVar5 == '\0') {
        iVar3 = xmlStrEqual(ns,"xmlns");
        if (iVar3 == 0) {
          xmlNsWarnMsg((xmlParserCtxtPtr)ctx,XML_WAR_NS_COLUMN,
                       "Avoid attribute ending with \':\' like \'%s\'\n",fullname,(xmlChar *)0x0);
        }
        else {
          xmlNsErrMsg((xmlParserCtxtPtr)ctx,XML_ERR_NS_DECL_ERROR,
                      "invalid namespace declaration \'%s\'\n",fullname,(xmlChar *)0x0);
        }
        if (ns != (xmlChar *)0x0) {
          (*xmlFree)(ns);
        }
        ns = (xmlChar *)0x0;
        (*xmlFree)(pxVar5);
        pxVar5 = xmlStrdup(fullname);
        goto LAB_0017d101;
      }
      goto LAB_0017d129;
    }
LAB_0017d150:
    xmlSAX2ErrMemory((xmlParserCtxtPtr)ctx,"xmlSAX2StartElement");
    pxVar7 = (xmlURIPtr)ns;
  }
  else {
    pxVar5 = xmlStrdup(fullname);
    ns = (xmlChar *)0x0;
LAB_0017d101:
    if (pxVar5 == (xmlChar *)0x0) goto LAB_0017d150;
LAB_0017d129:
    if (((value == (xmlChar *)0x0) && (*(int *)((long)ctx + 0x34) != 0)) &&
       (iVar3 = htmlIsBooleanAttr(fullname), iVar3 != 0)) {
      pxVar6 = (xmlURIPtr)xmlStrdup(fullname);
      value = (xmlChar *)pxVar6;
    }
    else {
      *(undefined4 *)((long)ctx + 0xe0) = 1;
      pxVar6 = (xmlURIPtr)
               xmlValidCtxtNormalizeAttributeValue
                         ((xmlValidCtxtPtr)((long)ctx + 0xa0),*(xmlDocPtr *)((long)ctx + 0x10),
                          *(xmlNodePtr *)((long)ctx + 0x50),fullname,value);
      if (*(int *)((long)ctx + 0xe0) != 1) {
        *(undefined4 *)((long)ctx + 0x98) = 0;
      }
      if (pxVar6 != (xmlURIPtr)0x0) {
        value = (xmlChar *)pxVar6;
      }
    }
    pxVar7 = (xmlURIPtr)value;
    if (ns == (xmlChar *)0x0 && *(int *)((long)ctx + 0x34) == 0) {
      if (((((*pxVar5 != 'x') || (pxVar5[1] != 'm')) || (pxVar5[2] != 'l')) ||
          ((pxVar5[3] != 'n' || (pxVar5[4] != 's')))) || (pxVar5[5] != '\0')) {
LAB_0017d461:
        pxVar9 = (xmlNsPtr)0x0;
        goto LAB_0017d464;
      }
      if (*(int *)((long)ctx + 0x1c) != 0) {
LAB_0017d241:
        if (*(char *)&pxVar7->scheme != '\0') {
          pxVar8 = xmlParseURI((char *)pxVar7);
          if (pxVar8 == (xmlURIPtr)0x0) {
            if ((*ctx != 0) && (pcVar2 = *(code **)(*ctx + 0xa8), pcVar2 != (code *)0x0)) {
              (*pcVar2)(*(undefined8 *)((long)ctx + 8),"xmlns: %s not a valid URI\n",pxVar7);
            }
          }
          else {
            if (((pxVar8->scheme == (char *)0x0) && (*ctx != 0)) &&
               (pcVar2 = *(code **)(*ctx + 0xa8), pcVar2 != (code *)0x0)) {
              local_38 = pxVar8;
              (*pcVar2)(*(undefined8 *)((long)ctx + 8),"xmlns: URI %s is not absolute\n",pxVar7);
              pxVar8 = local_38;
            }
            xmlFreeURI(pxVar8);
          }
        }
        pxVar9 = xmlNewNs(*(xmlNodePtr *)((long)ctx + 0x50),(xmlChar *)pxVar7,(xmlChar *)0x0);
        if (((pxVar9 != (xmlNsPtr)0x0) && (*(int *)((long)ctx + 0x9c) != 0)) &&
           ((*(int *)((long)ctx + 0x18) != 0 &&
            ((pxVar14 = *(xmlDocPtr *)((long)ctx + 0x10), pxVar14 != (xmlDocPtr)0x0 &&
             (pxVar14->intSubset != (_xmlDtd *)0x0)))))) {
          uVar4 = xmlValidateOneNamespace
                            ((xmlValidCtxtPtr)((long)ctx + 0xa0),pxVar14,
                             *(xmlNodePtr *)((long)ctx + 0x50),prefix,pxVar9,(xmlChar *)pxVar7);
          *(uint *)((long)ctx + 0x98) = *(uint *)((long)ctx + 0x98) & uVar4;
        }
LAB_0017d8f5:
        (*xmlFree)(pxVar5);
        if (pxVar6 != (xmlURIPtr)0x0) {
          (*xmlFree)(pxVar6);
        }
        if (pxVar7 == (xmlURIPtr)value) {
          return;
        }
        goto LAB_0017d679;
      }
      *(int *)((long)ctx + 0x188) = *(int *)((long)ctx + 0x188) + 1;
      pxVar7 = (xmlURIPtr)xmlStringDecodeEntities((xmlParserCtxtPtr)ctx,value,1,'\0','\0','\0');
      *(int *)((long)ctx + 0x188) = *(int *)((long)ctx + 0x188) + -1;
      if (pxVar7 != (xmlURIPtr)0x0) goto LAB_0017d241;
      xmlSAX2ErrMemory((xmlParserCtxtPtr)ctx,"xmlSAX2StartElement");
      (*xmlFree)(pxVar5);
      pxVar7 = pxVar6;
    }
    else {
      if (ns == (xmlChar *)0x0 || *(int *)((long)ctx + 0x34) != 0) {
        if (ns == (xmlChar *)0x0) goto LAB_0017d461;
      }
      else if ((((*ns == 'x') && (ns[1] == 'm')) &&
               ((ns[2] == 'l' && ((ns[3] == 'n' && (ns[4] == 's')))))) && (ns[5] == '\0')) {
        if (*(int *)((long)ctx + 0x1c) == 0) {
          *(int *)((long)ctx + 0x188) = *(int *)((long)ctx + 0x188) + 1;
          pxVar7 = (xmlURIPtr)xmlStringDecodeEntities((xmlParserCtxtPtr)ctx,value,1,'\0','\0','\0');
          *(int *)((long)ctx + 0x188) = *(int *)((long)ctx + 0x188) + -1;
          if (pxVar7 == (xmlURIPtr)0x0) {
            xmlSAX2ErrMemory((xmlParserCtxtPtr)ctx,"xmlSAX2StartElement");
            (*xmlFree)(ns);
            (*xmlFree)(pxVar5);
            pxVar7 = pxVar6;
            goto joined_r0x0017d677;
          }
        }
        if (*(char *)&pxVar7->scheme == '\0') {
          xmlNsErrMsg((xmlParserCtxtPtr)ctx,XML_NS_ERR_EMPTY,"Empty namespace name for prefix %s\n",
                      pxVar5,(xmlChar *)0x0);
        }
        if ((*(int *)((long)ctx + 0x1a4) != 0) && (*(char *)&pxVar7->scheme != '\0')) {
          pxVar8 = xmlParseURI((char *)pxVar7);
          if (pxVar8 == (xmlURIPtr)0x0) {
            xmlNsWarnMsg((xmlParserCtxtPtr)ctx,XML_WAR_NS_URI,"xmlns:%s: %s not a valid URI\n",
                         pxVar5,value);
          }
          else {
            if (pxVar8->scheme == (char *)0x0) {
              local_38 = pxVar8;
              xmlNsWarnMsg((xmlParserCtxtPtr)ctx,XML_WAR_NS_URI_RELATIVE,
                           "xmlns:%s: URI %s is not absolute\n",pxVar5,value);
              pxVar8 = local_38;
            }
            xmlFreeURI(pxVar8);
          }
        }
        local_38 = (xmlURIPtr)xmlNewNs(*(xmlNodePtr *)((long)ctx + 0x50),(xmlChar *)pxVar7,pxVar5);
        (*xmlFree)(ns);
        if ((((local_38 != (xmlURIPtr)0x0) && (*(int *)((long)ctx + 0x9c) != 0)) &&
            (*(int *)((long)ctx + 0x18) != 0)) &&
           ((pxVar14 = *(xmlDocPtr *)((long)ctx + 0x10), pxVar14 != (xmlDocPtr)0x0 &&
            (pxVar14->intSubset != (_xmlDtd *)0x0)))) {
          uVar4 = xmlValidateOneNamespace
                            ((xmlValidCtxtPtr)((long)ctx + 0xa0),pxVar14,
                             *(xmlNodePtr *)((long)ctx + 0x50),prefix,(xmlNsPtr)local_38,value);
          *(uint *)((long)ctx + 0x98) = *(uint *)((long)ctx + 0x98) & uVar4;
        }
        goto LAB_0017d8f5;
      }
      pxVar9 = xmlSearchNs(*(xmlDocPtr *)((long)ctx + 0x10),*(xmlNodePtr *)((long)ctx + 0x50),ns);
      if (pxVar9 == (xmlNsPtr)0x0) {
        xmlNsErrMsg((xmlParserCtxtPtr)ctx,XML_NS_ERR_UNDEFINED_NAMESPACE,
                    "Namespace prefix %s of attribute %s is not defined\n",ns,pxVar5);
        goto LAB_0017d461;
      }
      plVar15 = (long *)(*(long *)((long)ctx + 0x50) + 0x58);
      local_38 = pxVar6;
      while (lVar1 = *plVar15, pxVar6 = local_38, lVar1 != 0) {
        if (((*(long *)(lVar1 + 0x48) != 0) &&
            (iVar3 = xmlStrEqual(pxVar5,*(xmlChar **)(lVar1 + 0x10)), iVar3 != 0)) &&
           ((pxVar9 == *(xmlNsPtr *)(lVar1 + 0x48) ||
            (iVar3 = xmlStrEqual(pxVar9->href,(*(xmlNsPtr *)(lVar1 + 0x48))->href), iVar3 != 0)))) {
          xmlNsErrMsg((xmlParserCtxtPtr)ctx,XML_ERR_ATTRIBUTE_REDEFINED,
                      "Attribute %s in %s redefined\n",pxVar5,pxVar9->href);
          *(undefined4 *)((long)ctx + 0x18) = 0;
          if (*(int *)((long)ctx + 0x1c0) == 0) {
            *(undefined4 *)((long)ctx + 0x14c) = 1;
          }
          (*xmlFree)(pxVar5);
          pxVar6 = local_38;
          goto LAB_0017d65e;
        }
        plVar15 = (long *)(lVar1 + 0x30);
      }
LAB_0017d464:
      attr = (_xmlNode *)
             xmlNewNsPropEatName(*(xmlNodePtr *)((long)ctx + 0x50),pxVar9,pxVar5,(xmlChar *)0x0);
      if (attr != (_xmlNode *)0x0) {
        if ((*(int *)((long)ctx + 0x1c) == 0) && (*(int *)((long)ctx + 0x34) == 0)) {
          p_Var11 = xmlStringGetNodeList(*(xmlDoc **)((long)ctx + 0x10),value);
          attr->children = p_Var11;
          while (p_Var12 = p_Var11, p_Var12 != (_xmlNode *)0x0) {
            p_Var12->parent = attr;
            p_Var11 = p_Var12->next;
            if (p_Var11 == (_xmlNode *)0x0) {
              attr->last = p_Var12;
            }
          }
        }
        else if ((xmlURIPtr)value != (xmlURIPtr)0x0) {
          pxVar10 = xmlNewDocText(*(xmlDoc **)((long)ctx + 0x10),value);
          attr->children = pxVar10;
          attr->last = pxVar10;
          if (pxVar10 != (xmlNodePtr)0x0) {
            pxVar10->parent = attr;
          }
        }
      }
      if ((((*(int *)((long)ctx + 0x34) == 0) && (*(int *)((long)ctx + 0x9c) != 0)) &&
          (*(int *)((long)ctx + 0x18) != 0)) &&
         ((pxVar14 = *(xmlDocPtr *)((long)ctx + 0x10), pxVar14 != (xmlDocPtr)0x0 &&
          (pxVar14->intSubset != (_xmlDtd *)0x0)))) {
        if (*(int *)((long)ctx + 0x1c) == 0) {
          *(int *)((long)ctx + 0x188) = *(int *)((long)ctx + 0x188) + 1;
          pxVar5 = xmlStringDecodeEntities((xmlParserCtxtPtr)ctx,value,1,'\0','\0','\0');
          *(int *)((long)ctx + 0x188) = *(int *)((long)ctx + 0x188) + -1;
          if (pxVar5 != (xmlChar *)0x0) {
            pxVar13 = xmlValidNormalizeAttributeValue
                                (*(xmlDocPtr *)((long)ctx + 0x10),*(xmlNodePtr *)((long)ctx + 0x50),
                                 fullname,pxVar5);
            if (pxVar13 != (xmlChar *)0x0) {
              (*xmlFree)(pxVar5);
              pxVar5 = pxVar13;
            }
            uVar4 = xmlValidateOneAttribute
                              ((xmlValidCtxtPtr)((long)ctx + 0xa0),*(xmlDocPtr *)((long)ctx + 0x10),
                               *(xmlNodePtr *)((long)ctx + 0x50),(xmlAttrPtr)attr,pxVar5);
            *(uint *)((long)ctx + 0x98) = *(uint *)((long)ctx + 0x98) & uVar4;
            (*xmlFree)(pxVar5);
            goto LAB_0017d65e;
          }
          pxVar14 = *(xmlDocPtr *)((long)ctx + 0x10);
        }
        uVar4 = xmlValidateOneAttribute
                          ((xmlValidCtxtPtr)((long)ctx + 0xa0),pxVar14,
                           *(xmlNodePtr *)((long)ctx + 0x50),(xmlAttrPtr)attr,value);
        *(uint *)((long)ctx + 0x98) = *(uint *)((long)ctx + 0x98) & uVar4;
      }
      else if ((*(byte *)((long)ctx + 0x1b0) & 8) == 0) {
        if (*(int *)((long)ctx + 0x1c) == 0) {
          if (*(int *)((long)ctx + 0x94) != 2) goto LAB_0017d530;
        }
        else if (*(int *)((long)ctx + 0x150) == 0) {
LAB_0017d530:
          iVar3 = xmlStrEqual(fullname,(xmlChar *)"xml:id");
          if (iVar3 == 0) {
            iVar3 = xmlIsID(*(xmlDocPtr *)((long)ctx + 0x10),*(xmlNodePtr *)((long)ctx + 0x50),
                            (xmlAttrPtr)attr);
            if (iVar3 == 0) {
              iVar3 = xmlIsRef(*(xmlDocPtr *)((long)ctx + 0x10),*(xmlNodePtr *)((long)ctx + 0x50),
                               (xmlAttrPtr)attr);
              if (iVar3 != 0) {
                xmlAddRef((xmlValidCtxtPtr)((long)ctx + 0xa0),*(xmlDocPtr *)((long)ctx + 0x10),value
                          ,(xmlAttrPtr)attr);
              }
              goto LAB_0017d65e;
            }
          }
          else {
            iVar3 = xmlValidateNCName(value,1);
            if (iVar3 != 0) {
              xmlErrValid((xmlParserCtxtPtr)ctx,XML_DTD_XMLID_VALUE,
                          "xml:id : attribute value %s is not an NCName\n",(char *)value,(char *)0x0
                         );
            }
          }
          xmlAddID((xmlValidCtxtPtr)((long)ctx + 0xa0),*(xmlDocPtr *)((long)ctx + 0x10),value,
                   (xmlAttrPtr)attr);
        }
      }
LAB_0017d65e:
      pxVar7 = (xmlURIPtr)ns;
      if (pxVar6 != (xmlURIPtr)0x0) {
        (*xmlFree)(pxVar6);
        pxVar7 = (xmlURIPtr)ns;
      }
    }
  }
joined_r0x0017d677:
  if (pxVar7 == (xmlURIPtr)0x0) {
    return;
  }
LAB_0017d679:
  (*xmlFree)(pxVar7);
  return;
}

Assistant:

static void
xmlSAX2AttributeInternal(void *ctx, const xmlChar *fullname,
             const xmlChar *value, const xmlChar *prefix ATTRIBUTE_UNUSED)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlAttrPtr ret;
    xmlChar *name;
    xmlChar *ns;
    xmlChar *nval;
    xmlNsPtr namespace;

    if (ctxt->html) {
	name = xmlStrdup(fullname);
	ns = NULL;
	namespace = NULL;
    } else {
	/*
	 * Split the full name into a namespace prefix and the tag name
	 */
	name = xmlSplitQName(ctxt, fullname, &ns);
	if ((name != NULL) && (name[0] == 0)) {
	    if (xmlStrEqual(ns, BAD_CAST "xmlns")) {
		xmlNsErrMsg(ctxt, XML_ERR_NS_DECL_ERROR,
			    "invalid namespace declaration '%s'\n",
			    fullname, NULL);
	    } else {
		xmlNsWarnMsg(ctxt, XML_WAR_NS_COLUMN,
			     "Avoid attribute ending with ':' like '%s'\n",
			     fullname, NULL);
	    }
	    if (ns != NULL)
		xmlFree(ns);
	    ns = NULL;
	    xmlFree(name);
	    name = xmlStrdup(fullname);
	}
    }
    if (name == NULL) {
        xmlSAX2ErrMemory(ctxt, "xmlSAX2StartElement");
	if (ns != NULL)
	    xmlFree(ns);
	return;
    }

#ifdef LIBXML_HTML_ENABLED
    if ((ctxt->html) &&
        (value == NULL) && (htmlIsBooleanAttr(fullname))) {
            nval = xmlStrdup(fullname);
            value = (const xmlChar *) nval;
    } else
#endif
    {
#ifdef LIBXML_VALID_ENABLED
        /*
         * Do the last stage of the attribute normalization
         * Needed for HTML too:
         *   http://www.w3.org/TR/html4/types.html#h-6.2
         */
        ctxt->vctxt.valid = 1;
        nval = xmlValidCtxtNormalizeAttributeValue(&ctxt->vctxt,
                                               ctxt->myDoc, ctxt->node,
                                               fullname, value);
        if (ctxt->vctxt.valid != 1) {
            ctxt->valid = 0;
        }
        if (nval != NULL)
            value = nval;
#else
        nval = NULL;
#endif /* LIBXML_VALID_ENABLED */
    }

    /*
     * Check whether it's a namespace definition
     */
    if ((!ctxt->html) && (ns == NULL) &&
        (name[0] == 'x') && (name[1] == 'm') && (name[2] == 'l') &&
        (name[3] == 'n') && (name[4] == 's') && (name[5] == 0)) {
	xmlNsPtr nsret;
	xmlChar *val;

        if (!ctxt->replaceEntities) {
	    ctxt->depth++;
	    val = xmlStringDecodeEntities(ctxt, value, XML_SUBSTITUTE_REF,
		                          0,0,0);
	    ctxt->depth--;
	    if (val == NULL) {
	        xmlSAX2ErrMemory(ctxt, "xmlSAX2StartElement");
		if (name != NULL)
		    xmlFree(name);
                if (nval != NULL)
                    xmlFree(nval);
		return;
	    }
	} else {
	    val = (xmlChar *) value;
	}

	if (val[0] != 0) {
	    xmlURIPtr uri;

	    uri = xmlParseURI((const char *)val);
	    if (uri == NULL) {
		if ((ctxt->sax != NULL) && (ctxt->sax->warning != NULL))
		    ctxt->sax->warning(ctxt->userData,
			 "xmlns: %s not a valid URI\n", val);
	    } else {
		if (uri->scheme == NULL) {
		    if ((ctxt->sax != NULL) && (ctxt->sax->warning != NULL))
			ctxt->sax->warning(ctxt->userData,
			     "xmlns: URI %s is not absolute\n", val);
		}
		xmlFreeURI(uri);
	    }
	}

	/* a default namespace definition */
	nsret = xmlNewNs(ctxt->node, val, NULL);

#ifdef LIBXML_VALID_ENABLED
	/*
	 * Validate also for namespace decls, they are attributes from
	 * an XML-1.0 perspective
	 */
        if (nsret != NULL && ctxt->validate && ctxt->wellFormed &&
	    ctxt->myDoc && ctxt->myDoc->intSubset)
	    ctxt->valid &= xmlValidateOneNamespace(&ctxt->vctxt, ctxt->myDoc,
					   ctxt->node, prefix, nsret, val);
#endif /* LIBXML_VALID_ENABLED */
	if (name != NULL)
	    xmlFree(name);
	if (nval != NULL)
	    xmlFree(nval);
	if (val != value)
	    xmlFree(val);
	return;
    }
    if ((!ctxt->html) &&
	(ns != NULL) && (ns[0] == 'x') && (ns[1] == 'm') && (ns[2] == 'l') &&
        (ns[3] == 'n') && (ns[4] == 's') && (ns[5] == 0)) {
	xmlNsPtr nsret;
	xmlChar *val;

        if (!ctxt->replaceEntities) {
	    ctxt->depth++;
	    val = xmlStringDecodeEntities(ctxt, value, XML_SUBSTITUTE_REF,
		                          0,0,0);
	    ctxt->depth--;
	    if (val == NULL) {
	        xmlSAX2ErrMemory(ctxt, "xmlSAX2StartElement");
	        xmlFree(ns);
		if (name != NULL)
		    xmlFree(name);
                if (nval != NULL)
                    xmlFree(nval);
		return;
	    }
	} else {
	    val = (xmlChar *) value;
	}

	if (val[0] == 0) {
	    xmlNsErrMsg(ctxt, XML_NS_ERR_EMPTY,
		        "Empty namespace name for prefix %s\n", name, NULL);
	}
	if ((ctxt->pedantic != 0) && (val[0] != 0)) {
	    xmlURIPtr uri;

	    uri = xmlParseURI((const char *)val);
	    if (uri == NULL) {
	        xmlNsWarnMsg(ctxt, XML_WAR_NS_URI,
			 "xmlns:%s: %s not a valid URI\n", name, value);
	    } else {
		if (uri->scheme == NULL) {
		    xmlNsWarnMsg(ctxt, XML_WAR_NS_URI_RELATIVE,
			   "xmlns:%s: URI %s is not absolute\n", name, value);
		}
		xmlFreeURI(uri);
	    }
	}

	/* a standard namespace definition */
	nsret = xmlNewNs(ctxt->node, val, name);
	xmlFree(ns);
#ifdef LIBXML_VALID_ENABLED
	/*
	 * Validate also for namespace decls, they are attributes from
	 * an XML-1.0 perspective
	 */
        if (nsret != NULL && ctxt->validate && ctxt->wellFormed &&
	    ctxt->myDoc && ctxt->myDoc->intSubset)
	    ctxt->valid &= xmlValidateOneNamespace(&ctxt->vctxt, ctxt->myDoc,
					   ctxt->node, prefix, nsret, value);
#endif /* LIBXML_VALID_ENABLED */
	if (name != NULL)
	    xmlFree(name);
	if (nval != NULL)
	    xmlFree(nval);
	if (val != value)
	    xmlFree(val);
	return;
    }

    if (ns != NULL) {
	namespace = xmlSearchNs(ctxt->myDoc, ctxt->node, ns);

	if (namespace == NULL) {
	    xmlNsErrMsg(ctxt, XML_NS_ERR_UNDEFINED_NAMESPACE,
		    "Namespace prefix %s of attribute %s is not defined\n",
		             ns, name);
	} else {
            xmlAttrPtr prop;

            prop = ctxt->node->properties;
            while (prop != NULL) {
                if (prop->ns != NULL) {
                    if ((xmlStrEqual(name, prop->name)) &&
                        ((namespace == prop->ns) ||
                         (xmlStrEqual(namespace->href, prop->ns->href)))) {
                            xmlNsErrMsg(ctxt, XML_ERR_ATTRIBUTE_REDEFINED,
                                    "Attribute %s in %s redefined\n",
                                             name, namespace->href);
                        ctxt->wellFormed = 0;
                        if (ctxt->recovery == 0) ctxt->disableSAX = 1;
                        if (name != NULL)
                            xmlFree(name);
                        goto error;
                    }
                }
                prop = prop->next;
            }
        }
    } else {
	namespace = NULL;
    }

    /* !!!!!! <a toto:arg="" xmlns:toto="http://toto.com"> */
    ret = xmlNewNsPropEatName(ctxt->node, namespace, name, NULL);

    if (ret != NULL) {
        if ((ctxt->replaceEntities == 0) && (!ctxt->html)) {
	    xmlNodePtr tmp;

	    ret->children = xmlStringGetNodeList(ctxt->myDoc, value);
	    tmp = ret->children;
	    while (tmp != NULL) {
		tmp->parent = (xmlNodePtr) ret;
		if (tmp->next == NULL)
		    ret->last = tmp;
		tmp = tmp->next;
	    }
	} else if (value != NULL) {
	    ret->children = xmlNewDocText(ctxt->myDoc, value);
	    ret->last = ret->children;
	    if (ret->children != NULL)
		ret->children->parent = (xmlNodePtr) ret;
	}
    }

#ifdef LIBXML_VALID_ENABLED
    if ((!ctxt->html) && ctxt->validate && ctxt->wellFormed &&
        ctxt->myDoc && ctxt->myDoc->intSubset) {

	/*
	 * If we don't substitute entities, the validation should be
	 * done on a value with replaced entities anyway.
	 */
        if (!ctxt->replaceEntities) {
	    xmlChar *val;

	    ctxt->depth++;
	    val = xmlStringDecodeEntities(ctxt, value, XML_SUBSTITUTE_REF,
		                          0,0,0);
	    ctxt->depth--;

	    if (val == NULL)
		ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt,
				ctxt->myDoc, ctxt->node, ret, value);
	    else {
		xmlChar *nvalnorm;

		/*
		 * Do the last stage of the attribute normalization
		 * It need to be done twice ... it's an extra burden related
		 * to the ability to keep xmlSAX2References in attributes
		 */
		nvalnorm = xmlValidNormalizeAttributeValue(ctxt->myDoc,
					    ctxt->node, fullname, val);
		if (nvalnorm != NULL) {
		    xmlFree(val);
		    val = nvalnorm;
		}

		ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt,
			        ctxt->myDoc, ctxt->node, ret, val);
                xmlFree(val);
	    }
	} else {
	    ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt, ctxt->myDoc,
					       ctxt->node, ret, value);
	}
    } else
#endif /* LIBXML_VALID_ENABLED */
           if (((ctxt->loadsubset & XML_SKIP_IDS) == 0) &&
	       (((ctxt->replaceEntities == 0) && (ctxt->external != 2)) ||
	        ((ctxt->replaceEntities != 0) && (ctxt->inSubset == 0)))) {
        /*
	 * when validating, the ID registration is done at the attribute
	 * validation level. Otherwise we have to do specific handling here.
	 */
	if (xmlStrEqual(fullname, BAD_CAST "xml:id")) {
	    /*
	     * Add the xml:id value
	     *
	     * Open issue: normalization of the value.
	     */
	    if (xmlValidateNCName(value, 1) != 0) {
	        xmlErrValid(ctxt, XML_DTD_XMLID_VALUE,
		      "xml:id : attribute value %s is not an NCName\n",
			    (const char *) value, NULL);
	    }
	    xmlAddID(&ctxt->vctxt, ctxt->myDoc, value, ret);
	} else if (xmlIsID(ctxt->myDoc, ctxt->node, ret))
	    xmlAddID(&ctxt->vctxt, ctxt->myDoc, value, ret);
	else if (xmlIsRef(ctxt->myDoc, ctxt->node, ret))
	    xmlAddRef(&ctxt->vctxt, ctxt->myDoc, value, ret);
    }

error:
    if (nval != NULL)
	xmlFree(nval);
    if (ns != NULL)
	xmlFree(ns);
}